

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool search_directory_or_file(char *path,char *wildcard,_Bool isDirectory,char *result)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  dirent *pdVar4;
  long lVar5;
  code *pcVar6;
  ulong uVar7;
  char *in_RCX;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  _Bool found;
  dirent *entry;
  char temp [260];
  char opendirpath [260];
  DIR *dir;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  byte bVar8;
  char local_248 [536];
  DIR *local_30;
  char *local_28;
  byte local_19;
  char *local_18;
  char *local_10;
  _Bool local_1;
  
  local_19 = in_DL & 1;
  if ((in_RDI == (char *)0x0) ||
     (local_28 = in_RCX, local_18 = in_RSI, local_10 = in_RDI, sVar3 = strlen(in_RDI), sVar3 == 0))
  {
    local_1 = false;
  }
  else if ((local_18 == (char *)0x0) || (sVar3 = strlen(local_18), sVar3 == 0)) {
    local_1 = false;
  }
  else {
    sVar3 = strlen(local_10);
    if (sVar3 + 1 < 0x105) {
      clear_path_string(in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
      local_30 = opendir(local_10);
      if (local_30 == (DIR *)0x0) {
        local_1 = false;
      }
      else {
        bVar8 = 0;
        do {
          do {
            do {
              pdVar4 = readdir(local_30);
              if (pdVar4 == (dirent *)0x0) goto LAB_00194aec;
              iVar2 = strcmp(pdVar4->d_name,".");
            } while ((iVar2 == 0) || (iVar2 = strcmp(pdVar4->d_name,".."), iVar2 == 0));
            sVar3 = strlen(local_10);
            lVar5 = sVar3 + 1;
            sVar3 = strlen(pdVar4->d_name);
          } while (0x104 < lVar5 + sVar3 + 2);
          strcpy(local_248,local_10);
          add_slash((char *)CONCAT17(bVar8,in_stack_fffffffffffffda8));
          strcat(local_248,pdVar4->d_name);
          pcVar6 = exists_file;
          if ((local_19 & 1) != 0) {
            pcVar6 = exists_dir;
          }
          uVar7 = (*pcVar6)(local_248);
        } while (((uVar7 & 1) == 0) ||
                (_Var1 = wildcard_match(in_stack_fffffffffffffd98,(char *)0x194ac5), !_Var1));
        strcpy(local_28,local_248);
        bVar8 = 1;
LAB_00194aec:
        closedir(local_30);
        local_1 = (_Bool)(bVar8 & 1);
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool search_directory_or_file(const char *path, const char *wildcard, bool isDirectory, char *result)
{
	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}
	if (wildcard == NULL || strlen(wildcard) == 0)
	{
		return false;
	}
	if (strlen(path) + 1 > MAX_PATH)
	{
		return false;
	}
	DIR *dir;
	char opendirpath[MAX_PATH];
	clear_path_string(opendirpath, MAX_PATH);
#if defined(_WIN32)
	char *res = u8tosjis_path(path, opendirpath);
	if (res == NULL)
	{
		return false;
	}	
	if ((dir = opendir(opendirpath)) == NULL)
#else
	if ((dir = opendir(path)) == NULL)
#endif
	{
		return false;
	}
	char temp[MAX_PATH];
	struct dirent *entry;
	bool found = false;
	//size_t len = strlen(wildcard);
	while ((entry = readdir(dir)) != NULL)
	{
		if (strcmp(entry->d_name, ".") == 0 || strcmp(entry->d_name, "..") == 0)
		{
			continue;
		}
		if (strlen(path) + 1 + strlen(entry->d_name) + 2 > MAX_PATH)
		{
			continue;
		}
		strcpy(temp, path);
		add_slash(temp);
		strcat(temp, entry->d_name);
		if ((isDirectory ? exists_dir : exists_file)(temp))
		{
			if (!wildcard_match(wildcard, entry->d_name))
			{
				continue;
			}
			strcpy(result, temp);
			found = true;
			break;
		}
	}
	closedir(dir);
	return found;
}